

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStreamClient.cpp
# Opt level: O2

Output_GetSegmentStaticScale * __thiscall
ViconDataStreamSDK::CPP::Client::GetSegmentStaticScale
          (Output_GetSegmentStaticScale *__return_storage_ptr__,Client *this,String *SubjectName,
          String *SegmentName)

{
  VClient *this_00;
  Enum i_Result;
  Enum EVar1;
  string sStack_58;
  string local_38;
  
  this_00 = (this->m_pClientImpl->m_pCoreClient).
            super___shared_ptr<ViconDataStreamSDK::Core::VClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  String::operator_cast_to_string(&local_38,SubjectName);
  String::operator_cast_to_string(&sStack_58,SegmentName);
  i_Result = Core::VClient::GetSegmentStaticScale
                       (this_00,&local_38,&sStack_58,&__return_storage_ptr__->Scale);
  EVar1 = Adapt(i_Result);
  __return_storage_ptr__->Result = EVar1;
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

CLASS_DECLSPEC
    Output_GetSegmentStaticScale Client::GetSegmentStaticScale(const String & SubjectName,
      const String & SegmentName) const
  {
    Output_GetSegmentStaticScale Output;
    Output.Result = Adapt(m_pClientImpl->m_pCoreClient->GetSegmentStaticScale(SubjectName,
      SegmentName,
      Output.Scale));

    return Output;
  }